

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O2

int main(int argc,char **argv)

{
  acutest_test_ *test;
  byte bVar1;
  char *__s;
  bool bVar2;
  acutest_test_data_ *paVar3;
  FILE *pFVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  acutest_state_ aVar8;
  __pid_t __pid;
  uint uVar9;
  int iVar10;
  size_t __n;
  char *pcVar11;
  ssize_t sVar12;
  char *pcVar13;
  uint *puVar14;
  ulong uVar15;
  timespec *ptVar16;
  int i;
  long lVar17;
  ulong uStack_280;
  undefined1 auStack_278 [8];
  acutest_timer_type_ end;
  undefined8 local_99;
  __time_t _Stack_91;
  long local_78;
  undefined1 local_70 [8];
  acutest_timer_type_ start;
  int exit_code;
  
  acutest_argv0_ = *argv;
  acutest_colorize_ = isatty(1);
  acutest_list_size_ = 3;
  acutest_test_data_ = (acutest_test_data_ *)calloc(3,0x10);
  if (acutest_test_data_ == (acutest_test_data_ *)0x0) {
    fwrite("Out of memory.\n",0xf,1,_stderr);
    acutest_exit_(2);
  }
  bVar2 = false;
  for (iVar6 = 1; iVar6 < argc; iVar6 = iVar6 + 1) {
    pcVar13 = argv[iVar6];
    if (bVar2) {
LAB_001096d4:
      iVar5 = acutest_cmdline_callback_(0,pcVar13);
LAB_001096df:
      if (iVar5 != 0) break;
    }
    else {
      if (*pcVar13 != '-') {
        bVar2 = false;
        goto LAB_001096d4;
      }
      bVar1 = pcVar13[1];
      if (bVar1 == 0) goto LAB_001096d4;
      if ((bVar1 != 0x2d) || (pcVar13[2] != '\0')) {
        pcVar11 = pcVar13 + 2;
        local_78 = (long)iVar6;
        for (puVar14 = &acutest_cmdline_options_[0].flags; iVar5 = puVar14[-1], iVar5 != 0;
            puVar14 = puVar14 + 6) {
          __s = *(char **)(puVar14 + -3);
          if (__s == (char *)0x0 || bVar1 != 0x2d) {
            if (bVar1 == ((ACUTEST_CMDLINE_OPTION_ *)(puVar14 + -5))->shortname) {
              if ((*puVar14 & 2) == 0) {
                iVar5 = acutest_cmdline_callback_(iVar5,(char *)0x0);
                if (iVar5 != 0) goto LAB_001098d8;
                pcVar13 = argv[local_78];
                bVar2 = false;
                if (pcVar13[2] == '\0') goto LAB_001096e7;
                lVar17 = 0;
                goto LAB_001097a2;
              }
              if (*pcVar11 == '\0') {
                iVar10 = iVar6 + 1;
                if (iVar10 < argc) {
                  iVar5 = acutest_cmdline_callback_(iVar5,argv[iVar10]);
                  bVar2 = false;
                  iVar6 = iVar10;
                  goto LAB_001096df;
                }
                iVar5 = -0x7ffffffe;
                pcVar11 = pcVar13;
              }
              iVar5 = acutest_cmdline_callback_(iVar5,pcVar11);
              bVar2 = false;
              goto LAB_001096df;
            }
          }
          else {
            __n = strlen(__s);
            iVar10 = strncmp(pcVar11,__s,__n);
            if (iVar10 == 0) {
              if (pcVar11[__n] == '=') {
                if ((*puVar14 & 3) == 0) {
                  pcVar13 = auStack_278;
                  snprintf(pcVar13,0x21,"--%s",__s);
                  iVar5 = -0x7ffffffd;
                  goto LAB_001098b0;
                }
                pcVar13 = pcVar11 + __n + 1;
LAB_0010987d:
                iVar5 = acutest_cmdline_callback_(iVar5,pcVar13);
              }
              else {
                if (pcVar11[__n] != '\0') goto LAB_001096cb;
                if ((*puVar14 & 2) != 0) {
                  iVar5 = -0x7ffffffe;
                  goto LAB_0010987d;
                }
                pcVar13 = (char *)0x0;
LAB_001098b0:
                iVar5 = acutest_cmdline_callback_(iVar5,pcVar13);
              }
              bVar2 = false;
              goto LAB_001096df;
            }
          }
LAB_001096cb:
        }
        if ((bVar1 == 0x2d) && (pcVar11 = strchr(pcVar13,0x3d), pcVar11 != (char *)0x0)) {
          uVar15 = (long)pcVar11 - (long)pcVar13;
          if (0x1f < (ulong)((long)pcVar11 - (long)pcVar13)) {
            uVar15 = 0x20;
          }
          strncpy(auStack_278,pcVar13,uVar15);
          auStack_278[uVar15] = 0;
          pcVar13 = auStack_278;
        }
        iVar5 = acutest_cmdline_callback_(-0x7fffffff,pcVar13);
        bVar2 = false;
        goto LAB_001096df;
      }
      bVar2 = true;
    }
LAB_001096e7:
  }
LAB_001098d8:
  if (acutest_timer_ - 1U < 2) {
    acutest_timer_id_ = acutest_timer_;
  }
  iVar6 = acutest_count_(ACUTEST_STATE_SELECTED);
  bVar1 = acutest_exclude_mode_;
  paVar3 = acutest_test_data_;
  if (iVar6 < 1) {
    for (lVar17 = 0; lVar17 != 0x30; lVar17 = lVar17 + 0x10) {
      *(undefined4 *)((long)&paVar3->state + lVar17) = 0xfffffffe;
    }
  }
  else {
    for (lVar17 = 0; lVar17 != 0x30; lVar17 = lVar17 + 0x10) {
      *(uint *)((long)&paVar3->state + lVar17) =
           ~(uint)(*(int *)((long)&paVar3->state + lVar17) == -3 ^ bVar1) | 0xfffffffe;
    }
  }
  iVar6 = acutest_no_exec_;
  if (acutest_no_exec_ < 0) {
    iVar5 = acutest_count_(ACUTEST_STATE_NEEDTORUN);
    iVar6 = 1;
    if (1 < iVar5) {
      auStack_278[0] = 10;
      iVar5 = open("/proc/self/status",0);
      iVar6 = 0;
      if (iVar5 != -1) {
        uStack_280 = 1;
LAB_001099a4:
        uVar15 = uStack_280;
        if (uVar15 < 0x1ff) goto code_r0x001099b0;
        goto LAB_001099d4;
      }
    }
  }
LAB_00109a59:
  acutest_no_exec_ = iVar6;
  if (acutest_tap_ == '\x01') {
    if (2 < acutest_verbose_level_) {
      acutest_verbose_level_ = 2;
    }
    acutest_no_summary_ = 1;
    if (acutest_worker_ == '\0') {
      uVar7 = acutest_count_(ACUTEST_STATE_NEEDTORUN);
      printf("1..%d\n",(ulong)uVar7);
    }
  }
  iVar6 = acutest_worker_index_;
  for (lVar17 = 0; iVar10 = acutest_list_size_, iVar5 = acutest_verbose_level_, lVar17 != 0x30;
      lVar17 = lVar17 + 0x10) {
    if (*(int *)((long)&acutest_test_data_->state + lVar17) == -2) {
      test = (acutest_test_ *)((long)&acutest_list_[0].name + lVar17);
      acutest_test_already_logged_ = 0;
      acutest_current_test_ = test;
      acutest_timer_get_time_((timespec *)local_70);
      if (acutest_no_exec_ == 0) {
        fflush(_stdout);
        fflush(_stderr);
        __pid = fork();
        if (__pid == -1) {
          puVar14 = (uint *)__errno_location();
          pcVar13 = strerror(*puVar14);
          acutest_error_("Cannot fork. %s [%d]",pcVar13,(ulong)*puVar14);
        }
        else {
          if (__pid == 0) {
            acutest_worker_ = 1;
            aVar8 = acutest_do_run_(test,iVar6);
            acutest_exit_(aVar8);
          }
          waitpid(__pid,(int *)((long)&start.tv_nsec + 4),0);
          uVar7 = start.tv_nsec._4_4_ & 0x7f;
          if (uVar7 == 0) {
            aVar8 = start.tv_nsec._4_4_ >> 8 & 0xff;
            goto LAB_00109bec;
          }
          if ((int)(uVar7 * 0x1000000 + 0x1000000) < 0x2000000) {
            acutest_error_("Test ended in an unexpected way [%d].",(ulong)start.tv_nsec._4_4_);
          }
          else {
            if ((uVar7 < 0x10) && ((0x452fU >> ((uint)((ulong)uVar7 - 1) & 0x1f) & 1) != 0)) {
              ptVar16 = (timespec *)
                        (&DAT_001370cc + *(int *)(&DAT_001370cc + ((ulong)uVar7 - 1) * 4));
            }
            else {
              snprintf((char *)auStack_278,0x20,"signal %d");
              ptVar16 = (timespec *)auStack_278;
            }
            acutest_error_("Test interrupted by %s.",ptVar16);
          }
        }
        aVar8 = ACUTEST_STATE_FAILED;
      }
      else {
        aVar8 = acutest_do_run_(test,iVar6);
      }
LAB_00109bec:
      iVar6 = iVar6 + 1;
      acutest_timer_get_time_((timespec *)auStack_278);
      paVar3 = acutest_test_data_;
      acutest_current_test_ = (acutest_test_ *)0x0;
      *(acutest_state_ *)((long)&acutest_test_data_->state + lVar17) = aVar8;
      *(double *)((long)&paVar3->duration + lVar17) =
           (double)(end.tv_sec - start.tv_sec) / 1000000000.0 +
           (double)((long)auStack_278 -
                   CONCAT53(local_70._3_5_,CONCAT12(local_70[2],CONCAT11(local_70[1],local_70[0]))))
      ;
    }
  }
  if (0 < acutest_verbose_level_ && (acutest_no_summary_ & 1) == 0) {
    iVar6 = acutest_count_(ACUTEST_STATE_EXCLUDED);
    uVar7 = acutest_count_(ACUTEST_STATE_SUCCESS);
    uVar9 = acutest_count_(ACUTEST_STATE_FAILED);
    if (2 < (uint)iVar5) {
      acutest_colored_printf_(10,"Summary:\n");
      printf("  Count of run unit tests:        %4d\n",(ulong)(uint)(iVar10 - iVar6));
      printf("  Count of successful unit tests: %4d\n",(ulong)uVar7);
      printf("  Count of failed unit tests:     %4d\n",(ulong)uVar9);
    }
    if (uVar9 == 0) {
      acutest_colored_printf_(0xc,"SUCCESS:");
      puts(" No unit tests have failed.");
    }
    else {
      acutest_colored_printf_(0xb,"FAILED:");
      pcVar13 = "have";
      if (uVar9 == 1) {
        pcVar13 = "has";
      }
      printf(" %d of %d unit tests %s failed.\n",(ulong)uVar9,(ulong)(uint)(iVar10 - iVar6),pcVar13)
      ;
    }
    if (2 < acutest_verbose_level_) {
      putchar(10);
    }
  }
  pFVar4 = acutest_xml_output_;
  if (acutest_xml_output_ != (FILE *)0x0) {
    pcVar13 = acutest_basename_(*argv);
    fwrite("<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n",0x27,1,(FILE *)pFVar4);
    pFVar4 = acutest_xml_output_;
    iVar6 = acutest_list_size_;
    uVar7 = acutest_count_(ACUTEST_STATE_FAILED);
    iVar5 = acutest_count_(ACUTEST_STATE_SKIPPED);
    iVar10 = acutest_count_(ACUTEST_STATE_EXCLUDED);
    fprintf((FILE *)pFVar4,
            "<testsuite name=\"%s\" tests=\"%d\" errors=\"0\" failures=\"%d\" skip=\"%d\">\n",
            pcVar13,(ulong)(uint)iVar6,(ulong)uVar7,(ulong)(uint)(iVar5 + iVar10));
    for (lVar17 = 0; paVar3 = acutest_test_data_, lVar17 != 0x30; lVar17 = lVar17 + 0x10) {
      fprintf((FILE *)acutest_xml_output_,"  <testcase name=\"%s\" time=\"%.2f\">\n",
              *(undefined8 *)((long)&acutest_test_data_->duration + lVar17),
              *(undefined8 *)((long)&acutest_list_[0].name + lVar17));
      iVar6 = *(int *)((long)&paVar3->state + lVar17);
      pcVar13 = "<skipped />";
      if (iVar6 == -1) {
LAB_00109e2d:
        fprintf((FILE *)acutest_xml_output_,"    %s\n",pcVar13);
      }
      else if (iVar6 != 0) {
        pcVar13 = "<skipped />";
        if (iVar6 != 2) {
          pcVar13 = "<failure />";
        }
        goto LAB_00109e2d;
      }
      fwrite("  </testcase>\n",0xe,1,(FILE *)acutest_xml_output_);
    }
    fwrite("</testsuite>\n",0xd,1,(FILE *)acutest_xml_output_);
    fclose((FILE *)acutest_xml_output_);
  }
  if ((acutest_worker_ == '\x01') &&
     (iVar6 = acutest_count_(ACUTEST_STATE_EXCLUDED), iVar6 + 1 == acutest_list_size_)) {
    lVar17 = 0;
    do {
      if (lVar17 + 0x10 == 0x40) {
        uVar7 = 1;
        break;
      }
      uVar7 = *(uint *)((long)&acutest_test_data_->state + lVar17);
      lVar17 = lVar17 + 0x10;
    } while (uVar7 == 0xffffffff);
  }
  else {
    iVar6 = acutest_count_(ACUTEST_STATE_FAILED);
    uVar7 = (uint)(0 < iVar6);
  }
  acutest_cleanup_();
  return uVar7;
LAB_001097a2:
  bVar1 = pcVar13[lVar17 + 2];
  if (bVar1 == 0) goto LAB_001096e7;
  for (puVar14 = &acutest_cmdline_options_[0].flags; puVar14[-1] != 0; puVar14 = puVar14 + 6) {
    if (bVar1 == ((ACUTEST_CMDLINE_OPTION_ *)(puVar14 + -5))->shortname) {
      iVar5 = -0x7ffffffe;
      if ((*puVar14 & 2) != 0) goto LAB_001097dd;
      pcVar11 = (char *)0x0;
      iVar5 = puVar14[-1];
      goto LAB_001097ee;
    }
  }
  iVar5 = -0x7fffffff;
LAB_001097dd:
  local_70[0] = '-';
  local_70[2] = 0;
  pcVar11 = local_70;
  local_70[1] = bVar1;
LAB_001097ee:
  iVar5 = acutest_cmdline_callback_(iVar5,pcVar11);
  lVar17 = lVar17 + 1;
  if (iVar5 != 0) goto LAB_001098d8;
  goto LAB_001097a2;
code_r0x001099b0:
  sVar12 = read(iVar5,auStack_278 + uVar15,0x1ff - uVar15);
  uStack_280 = sVar12 + uVar15;
  if (0 < sVar12) goto LAB_001099a4;
LAB_001099d4:
  auStack_278[uVar15] = 0;
  pcVar13 = strstr(auStack_278,"\nTracerPid:");
  if (pcVar13 < (char *)((long)&local_99 + 1U) && pcVar13 != (char *)0x0) {
    iVar10 = atoi(pcVar13 + 0xb);
    close(iVar5);
    iVar6 = 0;
    if (iVar10 != 0) {
      iVar6 = 1;
    }
    goto LAB_00109a59;
  }
  if (uVar15 == 0x1ff) {
    auStack_278 = (undefined1  [8])local_99;
    end.tv_sec = _Stack_91;
    uStack_280 = 0x20;
    goto LAB_001099a4;
  }
  close(iVar5);
  iVar6 = 0;
  goto LAB_00109a59;
}

Assistant:

int
main(int argc, char** argv)
{
    int i, index;
    int exit_code = 1;

    acutest_argv0_ = argv[0];

#if defined ACUTEST_UNIX_
    acutest_colorize_ = isatty(STDOUT_FILENO);
#elif defined ACUTEST_WIN_
 #if defined _BORLANDC_
    acutest_colorize_ = isatty(_fileno(stdout));
 #else
    acutest_colorize_ = _isatty(_fileno(stdout));
 #endif
#else
    acutest_colorize_ = 0;
#endif

    /* Count all test units */
    acutest_list_size_ = 0;
    for(i = 0; acutest_list_[i].func != NULL; i++)
        acutest_list_size_++;

    acutest_test_data_ = (struct acutest_test_data_*)calloc(acutest_list_size_, sizeof(struct acutest_test_data_));
    if(acutest_test_data_ == NULL) {
        fprintf(stderr, "Out of memory.\n");
        acutest_exit_(2);
    }

    /* Parse options */
    acutest_cmdline_read_(acutest_cmdline_options_, argc, argv, acutest_cmdline_callback_);

    /* Initialize the proper timer. */
    acutest_timer_init_();

#if defined(ACUTEST_WIN_)
    SetUnhandledExceptionFilter(acutest_seh_exception_filter_);
#ifdef _MSC_VER
    _set_abort_behavior(0, _WRITE_ABORT_MSG);
#endif
#endif

    /* Determine what to run. */
    if(acutest_count_(ACUTEST_STATE_SELECTED) > 0) {
        enum acutest_state_ if_selected;
        enum acutest_state_ if_unselected;

        if(!acutest_exclude_mode_) {
            if_selected = ACUTEST_STATE_NEEDTORUN;
            if_unselected = ACUTEST_STATE_EXCLUDED;
        } else {
            if_selected = ACUTEST_STATE_EXCLUDED;
            if_unselected = ACUTEST_STATE_NEEDTORUN;
        }

        for(i = 0; acutest_list_[i].func != NULL; i++) {
            if(acutest_test_data_[i].state == ACUTEST_STATE_SELECTED)
                acutest_test_data_[i].state = if_selected;
            else
                acutest_test_data_[i].state = if_unselected;
        }
    } else {
        /* By default, we want to run all tests. */
        for(i = 0; acutest_list_[i].func != NULL; i++)
            acutest_test_data_[i].state = ACUTEST_STATE_NEEDTORUN;
    }

    /* By default, we want to suppress running tests as child processes if we
     * run just one test, or if we're under debugger: Debugging tests is then
     * so much easier. */
    if(acutest_no_exec_ < 0) {
        if(acutest_count_(ACUTEST_STATE_NEEDTORUN) <= 1  ||  acutest_under_debugger_())
            acutest_no_exec_ = 1;
        else
            acutest_no_exec_ = 0;
    }

    if(acutest_tap_) {
        /* TAP requires we know test result ("ok", "not ok") before we output
         * anything about the test, and this gets problematic for larger verbose
         * levels. */
        if(acutest_verbose_level_ > 2)
            acutest_verbose_level_ = 2;

        /* TAP harness should provide some summary. */
        acutest_no_summary_ = 1;

        if(!acutest_worker_)
            printf("1..%d\n", acutest_count_(ACUTEST_STATE_NEEDTORUN));
    }

    index = acutest_worker_index_;
    for(i = 0; acutest_list_[i].func != NULL; i++) {
        if(acutest_test_data_[i].state == ACUTEST_STATE_NEEDTORUN)
            acutest_run_(&acutest_list_[i], index++, i);
    }

    /* Write a summary */
    if(!acutest_no_summary_ && acutest_verbose_level_ >= 1) {
        int n_run, n_success, n_failed ;

        n_run = acutest_list_size_ - acutest_count_(ACUTEST_STATE_EXCLUDED);
        n_success = acutest_count_(ACUTEST_STATE_SUCCESS);
        n_failed = acutest_count_(ACUTEST_STATE_FAILED);

        if(acutest_verbose_level_ >= 3) {
            acutest_colored_printf_(ACUTEST_COLOR_DEFAULT_INTENSIVE_, "Summary:\n");

            printf("  Count of run unit tests:        %4d\n", n_run);
            printf("  Count of successful unit tests: %4d\n", n_success);
            printf("  Count of failed unit tests:     %4d\n", n_failed);
        }

        if(n_failed == 0) {
            acutest_colored_printf_(ACUTEST_COLOR_GREEN_INTENSIVE_, "SUCCESS:");
            printf(" No unit tests have failed.\n");
        } else {
            acutest_colored_printf_(ACUTEST_COLOR_RED_INTENSIVE_, "FAILED:");
            printf(" %d of %d unit tests %s failed.\n",
                    n_failed, n_run, (n_failed == 1) ? "has" : "have");
        }

        if(acutest_verbose_level_ >= 3)
            printf("\n");
    }

    if (acutest_xml_output_) {
        const char* suite_name = acutest_basename_(argv[0]);
        fprintf(acutest_xml_output_, "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
        fprintf(acutest_xml_output_, "<testsuite name=\"%s\" tests=\"%d\" errors=\"0\" failures=\"%d\" skip=\"%d\">\n",
            suite_name,
            (int)acutest_list_size_,
            acutest_count_(ACUTEST_STATE_FAILED),
            acutest_count_(ACUTEST_STATE_SKIPPED) + acutest_count_(ACUTEST_STATE_EXCLUDED));
        for(i = 0; acutest_list_[i].func != NULL; i++) {
            struct acutest_test_data_ *details = &acutest_test_data_[i];
            const char* str_state;
            fprintf(acutest_xml_output_, "  <testcase name=\"%s\" time=\"%.2f\">\n", acutest_list_[i].name, details->duration);

            switch(details->state) {
                case ACUTEST_STATE_SUCCESS:     str_state = NULL; break;
                case ACUTEST_STATE_EXCLUDED:    /* Fall through. */
                case ACUTEST_STATE_SKIPPED:     str_state = "<skipped />"; break;
                case ACUTEST_STATE_FAILED:      /* Fall through. */
                default:                        str_state = "<failure />"; break;
            }

            if(str_state != NULL)
                fprintf(acutest_xml_output_, "    %s\n", str_state);
            fprintf(acutest_xml_output_, "  </testcase>\n");
        }
        fprintf(acutest_xml_output_, "</testsuite>\n");
        fclose(acutest_xml_output_);
    }

    if(acutest_worker_  &&  acutest_count_(ACUTEST_STATE_EXCLUDED)+1 == acutest_list_size_) {
        /* If we are the child process, we need to propagate the test state
         * without any moderation. */
        for(i = 0; acutest_list_[i].func != NULL; i++) {
            if(acutest_test_data_[i].state != ACUTEST_STATE_EXCLUDED) {
                exit_code = (int) acutest_test_data_[i].state;
                break;
            }
        }
    } else {
        if(acutest_count_(ACUTEST_STATE_FAILED) > 0)
            exit_code = 1;
        else
            exit_code = 0;
    }

    acutest_cleanup_();
    return exit_code;
}